

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

int __thiscall BpTree<float>::FindKey(BpTree<float> *this,float k,IndexNode<float> *C)

{
  Addr p;
  Addr p_00;
  Addr p_01;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  IndexNode<float> local_118;
  Addr local_b8;
  Addr local_b0;
  Addr local_98;
  undefined4 local_90;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  IndexNode<float> D;
  IndexNode<float> *C_local;
  float k_local;
  BpTree<float> *this_local;
  
  D.self = (Addr)C;
  IndexNode<float>::IndexNode((IndexNode<float> *)local_88,this->N);
  if ((this->RootAddr).FileOff == -1) {
    this_local._4_4_ = -1;
  }
  else {
    local_98 = this->RootAddr;
    FindNode(this,local_98,(IndexNode<float> *)D.self);
    while (*(char *)D.self != '1') {
      local_8c = 0;
      while( true ) {
        bVar1 = false;
        if (local_8c < this->N + -1) {
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                              (long)local_8c);
          bVar1 = false;
          if (*pvVar3 == '1') {
            pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)((long)D.self + 8),
                                (long)local_8c);
            bVar1 = *pvVar4 <= k && k != *pvVar4;
          }
        }
        if (!bVar1) break;
        local_8c = local_8c + 1;
      }
      if ((local_8c == this->N + -1) ||
         (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                              (long)local_8c), *pvVar3 == '0')) {
        pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                            (long)local_8c);
        local_b0.BlockNum = pvVar5->BlockNum;
        local_b0.FileOff = pvVar5->FileOff;
        FindNode(this,local_b0,(IndexNode<float> *)D.self);
      }
      else {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)((long)D.self + 8),
                            (long)local_8c);
        if ((k != *pvVar4) || (NAN(k) || NAN(*pvVar4))) {
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)((long)D.self + 8),
                              (long)local_8c);
          if (k < *pvVar4) {
            pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                                (long)local_8c);
            p_01.BlockNum = pvVar5->BlockNum;
            p_01.FileOff = pvVar5->FileOff;
            FindNode(this,p_01,(IndexNode<float> *)D.self);
          }
        }
        else {
          pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                              (long)local_8c);
          local_b8.BlockNum = pvVar5->BlockNum;
          local_b8.FileOff = pvVar5->FileOff;
          FindNode(this,local_b8,(IndexNode<float> *)local_88);
          IndexNode<float>::IndexNode(&local_118,(IndexNode<float> *)local_88);
          iVar2 = HaveK(this,&local_118,k);
          IndexNode<float>::~IndexNode(&local_118);
          if (iVar2 == 0) {
            pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                                (long)(local_8c + 1));
            p_00.BlockNum = pvVar5->BlockNum;
            p_00.FileOff = pvVar5->FileOff;
            FindNode(this,p_00,(IndexNode<float> *)D.self);
          }
          else {
            pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                                (long)local_8c);
            p.BlockNum = pvVar5->BlockNum;
            p.FileOff = pvVar5->FileOff;
            FindNode(this,p,(IndexNode<float> *)D.self);
          }
        }
      }
    }
    local_8c = 0;
    while( true ) {
      bVar1 = false;
      if (local_8c < this->N + -1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                            (long)local_8c);
        bVar1 = false;
        if (*pvVar3 == '1') {
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)((long)D.self + 8),
                              (long)local_8c);
          bVar1 = k != *pvVar4;
        }
      }
      if (!bVar1) break;
      local_8c = local_8c + 1;
    }
    if ((local_8c == this->N + -1) ||
       (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                            (long)local_8c), *pvVar3 == '0')) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = local_8c;
    }
  }
  local_90 = 1;
  IndexNode<float>::~IndexNode((IndexNode<float> *)local_88);
  return this_local._4_4_;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}